

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::BasicAuthIntegrationTest_shouldRejectMalformedBase64_Test::TestBody
          (BasicAuthIntegrationTest_shouldRejectMalformedBase64_Test *this)

{
  bool bVar1;
  pointer __p;
  char *message;
  AssertHelper local_b0;
  Message local_a8;
  int local_9c;
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  undefined1 local_78 [8];
  Response metrics;
  _func_void_curl_slist_ptr *local_28;
  undefined1 local_20 [8];
  unique_ptr<curl_slist,_void_(*)(curl_slist_*)> header;
  BasicAuthIntegrationTest_shouldRejectMalformedBase64_Test *this_local;
  
  header._M_t.super___uniq_ptr_impl<curl_slist,_void_(*)(curl_slist_*)>._M_t.
  super__Tuple_impl<0UL,_curl_slist_*,_void_(*)(curl_slist_*)>.
  super__Head_base<0UL,_curl_slist_*,_false>._M_head_impl = (curl_slist *)this;
  __p = (pointer)curl_slist_append(0,"Authorization: Basic $");
  local_28 = curl_slist_free_all;
  std::unique_ptr<curl_slist,void(*)(curl_slist*)>::unique_ptr<void(*)(curl_slist*),void>
            ((unique_ptr<curl_slist,void(*)(curl_slist*)> *)local_20,__p,&local_28);
  metrics.contentType.field_2._8_8_ = (unique_ptr<curl_slist,void(*)(curl_slist*)> *)local_20;
  std::function<void(void*)>::operator=
            ((function<void(void*)> *)
             &(this->super_BasicAuthIntegrationTest).super_IntegrationTest.fetchPrePerform_,
             (anon_class_8_1_5858d3cb *)((long)&metrics.contentType.field_2 + 8));
  IntegrationTest::FetchMetrics
            ((Response *)local_78,(IntegrationTest *)this,
             &(this->super_BasicAuthIntegrationTest).super_IntegrationTest.default_metrics_path_);
  local_9c = 0x191;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_98,"metrics.code","401",(long *)local_78,&local_9c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/integration_test.cc"
               ,0x11f,message);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  IntegrationTest::Response::~Response((Response *)local_78);
  std::unique_ptr<curl_slist,_void_(*)(curl_slist_*)>::~unique_ptr
            ((unique_ptr<curl_slist,_void_(*)(curl_slist_*)> *)local_20);
  return;
}

Assistant:

TEST_F(BasicAuthIntegrationTest, shouldRejectMalformedBase64) {
  std::unique_ptr<curl_slist, decltype(&curl_slist_free_all)> header(
      curl_slist_append(nullptr, "Authorization: Basic $"),
      curl_slist_free_all);

  fetchPrePerform_ = [&header](CURL* curl) {
    curl_easy_setopt(curl, CURLOPT_HTTPHEADER, header.get());
  };

  const auto metrics = FetchMetrics(default_metrics_path_);
  ASSERT_EQ(metrics.code, 401);
}